

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double erlang_cdf(double x,double a,double b,int c)

{
  double x2;
  double p2;
  double cdf;
  int c_local;
  double b_local;
  double a_local;
  double x_local;
  
  if (a <= x) {
    p2 = r8_gamma_inc((double)c,(x - a) / b);
  }
  else {
    p2 = 0.0;
  }
  return p2;
}

Assistant:

double erlang_cdf ( double x, double a, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_CDF evaluates the Erlang CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Output, double ERLANG_CDF, the value of the CDF.
//
{
  double cdf;
  double p2;
  double x2;

  if ( x < a )
  {
    cdf = 0.0;
  }
  else
  {
    x2 = ( x - a ) / b;
    p2 = static_cast<double>(c );

    cdf = r8_gamma_inc ( p2, x2 );
  }

  return cdf;
}